

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ugui.c
# Opt level: O1

void ugui_window_stack_pop(ugui_t *gui)

{
  uint uVar1;
  
  if (gui->window_index != 0) {
    _ugui_window_unload(gui->windows[gui->window_index - 1]);
    uVar1 = gui->window_index - 1;
    gui->window_index = uVar1;
    _ugui_window_load(gui->windows[uVar1]);
    return;
  }
  return;
}

Assistant:

void ugui_window_stack_pop(ugui_t* gui)
{
	//Unload last window
	if (gui->window_index > 0) {
		ugui_window_t *last = gui->windows[gui->window_index - 1];
		_ugui_window_unload(last);

		//Update pointer
		gui->window_index --;
		ugui_window_t *next = gui->windows[gui->window_index];

		//Load new window
		_ugui_window_load(next);
	}
}